

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

Atom * __thiscall r_code::vector<r_code::Atom>::operator[](vector<r_code::Atom> *this,size_t i)

{
  pointer pAVar1;
  long *plVar2;
  Atom *pAVar3;
  char *pcVar4;
  long lVar5;
  
  if ((ulong)((long)(this->m_vector).super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_vector).super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) <= i) {
    std::vector<r_code::Atom,_std::allocator<r_code::Atom>_>::resize(&this->m_vector,i + 1);
  }
  pAVar1 = (this->m_vector).super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (i < (ulong)((long)(this->m_vector).
                        super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pAVar1 >> 2)) {
    return pAVar1 + i * 4;
  }
  pcVar4 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",i);
  *(undefined ***)pcVar4 = &PTR__View_0011cb90;
  lVar5 = 0x58;
  do {
    pAVar3 = (Atom *)r_code::Atom::~Atom((Atom *)(pcVar4 + lVar5));
    lVar5 = lVar5 + -4;
  } while (lVar5 != 0x24);
  plVar2 = *(long **)(pcVar4 + 0x20);
  if (plVar2 != (long *)0x0) {
    LOCK();
    plVar2[1] = plVar2[1] + -1;
    UNLOCK();
    pAVar3 = (Atom *)plVar2[1];
    if ((long)pAVar3 < 1) {
      pAVar3 = (Atom *)(**(code **)(*plVar2 + 8))();
      return pAVar3;
    }
  }
  return pAVar3;
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }